

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_object.cc
# Opt level: O0

ASN1_OBJECT * ASN1_OBJECT_new(void)

{
  ASN1_OBJECT *ret;
  
  ret = (ASN1_OBJECT *)OPENSSL_malloc(0x28);
  if (ret == (ASN1_OBJECT *)0x0) {
    ret = (ASN1_OBJECT *)0x0;
  }
  else {
    ret->length = 0;
    ret->data = (uchar *)0x0;
    ret->nid = 0;
    ret->sn = (char *)0x0;
    ret->ln = (char *)0x0;
    ret->flags = 1;
  }
  return (ASN1_OBJECT *)ret;
}

Assistant:

ASN1_OBJECT *ASN1_OBJECT_new(void) {
  ASN1_OBJECT *ret;

  ret = (ASN1_OBJECT *)OPENSSL_malloc(sizeof(ASN1_OBJECT));
  if (ret == NULL) {
    return NULL;
  }
  ret->length = 0;
  ret->data = NULL;
  ret->nid = 0;
  ret->sn = NULL;
  ret->ln = NULL;
  ret->flags = ASN1_OBJECT_FLAG_DYNAMIC;
  return ret;
}